

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall GlobOpt::NewGenericValue(GlobOpt *this,ValueType valueType,Sym *sym)

{
  ValueInfo *valueInfo;
  Value *value;
  
  valueInfo = ValueInfo::New(this->alloc,valueType);
  value = NewValue(this,valueInfo);
  TrackNewValueForKills(this,value);
  GlobOptBlockData::SetValue(&this->currentBlock->globOptData,value,sym);
  return value;
}

Assistant:

Value *
GlobOpt::NewGenericValue(const ValueType valueType, Sym *const sym)
{
    ValueInfo *valueInfo = ValueInfo::New(this->alloc, valueType);
    Value *val = NewValue(valueInfo);
    TrackNewValueForKills(val);

    CurrentBlockData()->SetValue(val, sym);
    return val;
}